

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::CombinedImageSamplerUsageHandler::add_dependency
          (CombinedImageSamplerUsageHandler *this,uint32_t dst,uint32_t src)

{
  mapped_type *this_00;
  size_type sVar1;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t src_local;
  uint32_t dst_local;
  CombinedImageSamplerUsageHandler *this_local;
  
  local_18 = src;
  local_14 = dst;
  _src_local = this;
  this_00 = ::std::
            unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->dependency_hierarchy,&local_14);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::insert(this_00,&local_18);
  sVar1 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&this->comparison_ids,&local_18);
  if (sVar1 != 0) {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->comparison_ids,&local_14);
  }
  return;
}

Assistant:

void Compiler::CombinedImageSamplerUsageHandler::add_dependency(uint32_t dst, uint32_t src)
{
	dependency_hierarchy[dst].insert(src);
	// Propagate up any comparison state if we're loading from one such variable.
	if (comparison_ids.count(src))
		comparison_ids.insert(dst);
}